

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

loader_impl loader_impl_allocate(char *tag)

{
  loader_impl __ptr;
  set s;
  set s_00;
  vector v;
  set s_01;
  context ctx;
  set psVar1;
  
  __ptr = (loader_impl)calloc(1,0x58);
  if (__ptr != (loader_impl)0x0) {
    s = set_create(hash_callback_str,comparable_callback_str);
    __ptr->handle_impl_path_map = s;
    if (s != (set)0x0) {
      s_00 = set_create(hash_callback_ptr,comparable_callback_ptr);
      __ptr->handle_impl_map = s_00;
      if (s_00 != (set)0x0) {
        v = vector_create(8);
        __ptr->handle_impl_init_order = v;
        if (v != (vector)0x0) {
          s_01 = set_create(hash_callback_str,comparable_callback_str);
          __ptr->type_info_map = s_01;
          if (s_01 != (set)0x0) {
            ctx = context_create(tag);
            __ptr->ctx = ctx;
            if (ctx != (context)0x0) {
              psVar1 = set_create(hash_callback_str,comparable_callback_str);
              __ptr->exec_path_map = psVar1;
              if (psVar1 != (set)0x0) {
                return __ptr;
              }
              context_destroy(ctx);
            }
            set_destroy(s_01);
          }
          vector_destroy(v);
        }
        set_destroy(s_00);
      }
      set_destroy(s);
    }
    free(__ptr);
  }
  return (loader_impl)0x0;
}

Assistant:

loader_impl loader_impl_allocate(const loader_tag tag)
{
	loader_impl impl = malloc(sizeof(struct loader_impl_type));

	if (impl == NULL)
	{
		goto alloc_error;
	}

	memset(impl, 0, sizeof(struct loader_impl_type));

	impl->handle_impl_path_map = set_create(&hash_callback_str, &comparable_callback_str);

	if (impl->handle_impl_path_map == NULL)
	{
		goto alloc_handle_impl_path_map_error;
	}

	impl->handle_impl_map = set_create(&hash_callback_ptr, &comparable_callback_ptr);

	if (impl->handle_impl_map == NULL)
	{
		goto alloc_handle_impl_map_error;
	}

	impl->handle_impl_init_order = vector_create_type(loader_handle_impl);

	if (impl->handle_impl_init_order == NULL)
	{
		goto alloc_handle_impl_init_order_error;
	}

	impl->type_info_map = set_create(&hash_callback_str, &comparable_callback_str);

	if (impl->type_info_map == NULL)
	{
		goto alloc_type_info_map_error;
	}

	impl->ctx = context_create(tag);

	if (impl->ctx == NULL)
	{
		goto alloc_ctx_error;
	}

	impl->exec_path_map = set_create(&hash_callback_str, &comparable_callback_str);

	if (impl->exec_path_map == NULL)
	{
		goto alloc_exec_path_map_error;
	}

	return impl;

alloc_exec_path_map_error:
	context_destroy(impl->ctx);
alloc_ctx_error:
	set_destroy(impl->type_info_map);
alloc_type_info_map_error:
	vector_destroy(impl->handle_impl_init_order);
alloc_handle_impl_init_order_error:
	set_destroy(impl->handle_impl_map);
alloc_handle_impl_map_error:
	set_destroy(impl->handle_impl_path_map);
alloc_handle_impl_path_map_error:
	free(impl);
alloc_error:
	return NULL;
}